

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMeasurementsTest.cpp
# Opt level: O3

int TestMeasurementsTest(int argc,char **argv)

{
  pointer pcVar1;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _List_node_base _Var4;
  _List_node_base _Var5;
  _List_node_base _Var6;
  EStatusCode EVar7;
  EncryptionOptions *pEVar8;
  PDFPage *this;
  PageContentContext *inPageContext;
  PDFUsedFont *this_00;
  _List_node_base *p_Var9;
  long lVar10;
  int iVar11;
  char *pcVar12;
  _Alloc_hider _Var13;
  DoubleAndDoublePairList pathPoints;
  TextOptions textOptions;
  GraphicOptions pathStrokeOptions;
  TextMeasures textDimensions;
  PDFWriter pdfWriter;
  string local_1078;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1058;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_1050;
  undefined1 local_1040 [32];
  double local_1020;
  undefined1 local_1018 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1000;
  undefined1 local_fe8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fd8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fc8;
  _Alloc_hider local_fb0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fa0;
  string local_f88;
  string local_f68;
  undefined1 local_f48 [8];
  _Alloc_hider local_f40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f30;
  longlong local_f20;
  _Alloc_hider local_f18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f08;
  double local_ef8;
  undefined8 uStack_ef0;
  PDFWriter local_ee0;
  
  PDFWriter::PDFWriter(&local_ee0);
  paVar3 = &local_1078.field_2;
  local_1078._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1078,"TextMeasurementsTest.pdf","");
  BuildRelativeOutputPath((string *)local_1040,(char **)argv[2],&local_1078);
  local_f88._M_dataplus._M_p = (pointer)&local_f88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f88,"TextMeasurementsTest.log","");
  BuildRelativeOutputPath(&local_f68,(char **)argv[2],&local_f88);
  LogConfiguration::LogConfiguration((LogConfiguration *)local_1018,true,true,&local_f68);
  pEVar8 = EncryptionOptions::DefaultEncryptionOptions();
  local_f48[0] = pEVar8->ShouldEncrypt;
  pcVar1 = (pEVar8->UserPassword)._M_dataplus._M_p;
  local_f40._M_p = (pointer)&local_f30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f40,pcVar1,pcVar1 + (pEVar8->UserPassword)._M_string_length);
  local_f20 = pEVar8->UserProtectionOptionsFlag;
  pcVar1 = (pEVar8->OwnerPassword)._M_dataplus._M_p;
  local_f18._M_p = (pointer)&local_f08;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f18,pcVar1,pcVar1 + (pEVar8->OwnerPassword)._M_string_length);
  PDFCreationSettings::PDFCreationSettings
            ((PDFCreationSettings *)local_fe8,true,true,(EncryptionOptions *)local_f48,false);
  EVar7 = PDFWriter::StartPDF(&local_ee0,(string *)local_1040,ePDFVersion13,
                              (LogConfiguration *)local_1018,(PDFCreationSettings *)local_fe8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fb0._M_p != &local_fa0) {
    operator_delete(local_fb0._M_p,local_fa0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fd8._M_allocated_capacity != &local_fc8) {
    operator_delete((void *)local_fd8._M_allocated_capacity,local_fc8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f18._M_p != &local_f08) {
    operator_delete(local_f18._M_p,local_f08._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f40._M_p != &local_f30) {
    operator_delete(local_f40._M_p,local_f30._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1018._8_8_ != &local_1000) {
    operator_delete((void *)local_1018._8_8_,
                    CONCAT71(local_1000._M_allocated_capacity._1_7_,local_1000._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f68._M_dataplus._M_p != &local_f68.field_2) {
    operator_delete(local_f68._M_dataplus._M_p,local_f68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f88._M_dataplus._M_p != &local_f88.field_2) {
    operator_delete(local_f88._M_dataplus._M_p,local_f88.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_1040._4_4_,local_1040._0_4_) != local_1040 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_1040._4_4_,local_1040._0_4_),local_1040._16_8_ + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078._M_dataplus._M_p != paVar3) {
    operator_delete(local_1078._M_dataplus._M_p,local_1078.field_2._M_allocated_capacity + 1);
  }
  if (EVar7 != eSuccess) {
    iVar11 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to start file\n",0x15);
    goto LAB_0015474e;
  }
  this = (PDFPage *)operator_new(0x2b8);
  PDFPage::PDFPage(this);
  PDFRectangle::PDFRectangle((PDFRectangle *)local_fe8,0.0,0.0,595.0,842.0);
  PDFPage::SetMediaBox(this,(PDFRectangle *)local_fe8);
  PDFRectangle::~PDFRectangle((PDFRectangle *)local_fe8);
  inPageContext = PDFWriter::StartPageContentContext(&local_ee0,this);
  local_1078._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1078,"fonts/arial.ttf","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1018,argv[1],(allocator<char> *)&local_f68);
  LocalPathToFileURL((FileURL *)local_fe8,(string *)local_1018);
  RelativeURLToLocalPath((string *)local_1040,(FileURL *)local_fe8,&local_1078);
  FileURL::~FileURL((FileURL *)local_fe8);
  if ((undefined1 *)local_1018._0_8_ != local_1018 + 0x10) {
    operator_delete((void *)local_1018._0_8_,local_1018._16_8_ + 1);
  }
  this_00 = PDFWriter::GetFontForFile(&local_ee0,(string *)local_1040,0);
  if ((undefined1 *)CONCAT44(local_1040._4_4_,local_1040._0_4_) != local_1040 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_1040._4_4_,local_1040._0_4_),local_1040._16_8_ + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078._M_dataplus._M_p != paVar3) {
    operator_delete(local_1078._M_dataplus._M_p,local_1078.field_2._M_allocated_capacity + 1);
  }
  if (this_00 == (PDFUsedFont *)0x0) {
    iVar11 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to create font for arial font\n",0x25);
    goto LAB_0015474e;
  }
  local_fe8._0_8_ = &local_fd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fe8,"DarkMagenta","");
  local_1018._8_8_ = AbstractContentContext::ColorValueForName((string *)local_fe8);
  local_1018._0_8_ = (pointer)0x0;
  local_1018._16_8_ = 0x4010000000000000;
  local_1000._M_local_buf[0] = '\0';
  local_1000._8_8_ = 0x406fe00000000000;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fe8._0_8_ != &local_fd8) {
    operator_delete((void *)local_fe8._0_8_,(ulong)(local_fd8._M_allocated_capacity + 1));
  }
  local_1040._16_8_ = 0x402c000000000000;
  local_1040._0_4_ = eGray;
  local_1040._8_8_ = 0;
  local_1020 = 255.0;
  local_1078._M_dataplus._M_p = (pointer)paVar3;
  local_1040._24_8_ = this_00;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1078,"Hello World","");
  PDFUsedFont::CalculateTextDimensions((TextMeasures *)local_fe8,this_00,&local_1078,0xe);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078._M_dataplus._M_p != paVar3) {
    operator_delete(local_1078._M_dataplus._M_p,local_1078.field_2._M_allocated_capacity + 1);
  }
  local_1078._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1078,"Hello World","");
  AbstractContentContext::WriteText
            (&inPageContext->super_AbstractContentContext,10.0,100.0,&local_1078,
             (TextOptions *)local_1040);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078._M_dataplus._M_p != paVar3) {
    operator_delete(local_1078._M_dataplus._M_p,local_1078.field_2._M_allocated_capacity + 1);
  }
  local_1078.field_2._M_allocated_capacity = 0;
  local_1058 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_fe8._0_8_;
  paStack_1050 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_fe8._8_8_;
  local_1078._M_dataplus._M_p = (pointer)&local_1078;
  local_1078._M_string_length = (size_type)&local_1078;
  p_Var9 = (_List_node_base *)operator_new(0x20);
  _Var4._M_prev._0_4_ = SUB84((double)paStack_1050 + 98.0,0);
  _Var4._M_next = (_List_node_base *)((double)local_1058 + 10.0);
  _Var4._M_prev._4_4_ = (int)((ulong)((double)paStack_1050 + 98.0) >> 0x20);
  p_Var9[1] = _Var4;
  std::__detail::_List_node_base::_M_hook(p_Var9);
  local_1078.field_2._M_allocated_capacity = local_1078.field_2._M_allocated_capacity + 1;
  local_1058 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_fe8._8_8_;
  paStack_1050 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_fd8._M_allocated_capacity;
  p_Var9 = (_List_node_base *)operator_new(0x20);
  p_Var9[1]._M_next = (_List_node_base *)((double)paStack_1050 + 10.0);
  p_Var9[1]._M_prev = (_List_node_base *)((double)local_1058 + 98.0);
  std::__detail::_List_node_base::_M_hook(p_Var9);
  local_1078.field_2._M_allocated_capacity = local_1078.field_2._M_allocated_capacity + 1;
  AbstractContentContext::DrawPath
            (&inPageContext->super_AbstractContentContext,(DoubleAndDoublePairList *)&local_1078,
             (GraphicOptions *)local_1018);
  _Var13._M_p = local_1078._M_dataplus._M_p;
  if ((string *)local_1078._M_dataplus._M_p != &local_1078) {
    do {
      plVar2 = *(long **)_Var13._M_p;
      operator_delete(_Var13._M_p,0x20);
      _Var13._M_p = (pointer)plVar2;
    } while ((string *)plVar2 != &local_1078);
  }
  local_1078.field_2._M_allocated_capacity = 0;
  local_1058 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_fe8._0_8_;
  paStack_1050 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_fe8._8_8_;
  local_ef8 = (double)local_fd8._8_8_;
  uStack_ef0 = 0;
  local_1078._M_dataplus._M_p = (pointer)&local_1078;
  local_1078._M_string_length = (size_type)&local_1078;
  p_Var9 = (_List_node_base *)operator_new(0x20);
  _Var5._M_prev._0_4_ = SUB84(local_ef8 + 102.0,0);
  _Var5._M_next = (_List_node_base *)((double)local_1058 + 10.0);
  _Var5._M_prev._4_4_ = (int)((ulong)(local_ef8 + 102.0) >> 0x20);
  p_Var9[1] = _Var5;
  std::__detail::_List_node_base::_M_hook(p_Var9);
  local_1078.field_2._M_allocated_capacity = local_1078.field_2._M_allocated_capacity + 1;
  local_1058 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_fd8._M_allocated_capacity;
  paStack_1050 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_fd8._8_8_;
  p_Var9 = (_List_node_base *)operator_new(0x20);
  _Var6._M_prev._0_4_ = SUB84((double)paStack_1050 + 102.0,0);
  _Var6._M_next = (_List_node_base *)((double)local_1058 + 10.0);
  _Var6._M_prev._4_4_ = (int)((ulong)((double)paStack_1050 + 102.0) >> 0x20);
  p_Var9[1] = _Var6;
  std::__detail::_List_node_base::_M_hook(p_Var9);
  local_1078.field_2._M_allocated_capacity = local_1078.field_2._M_allocated_capacity + 1;
  AbstractContentContext::DrawPath
            (&inPageContext->super_AbstractContentContext,(DoubleAndDoublePairList *)&local_1078,
             (GraphicOptions *)local_1018);
  EVar7 = PDFWriter::EndPageContentContext(&local_ee0,inPageContext);
  if (EVar7 == eSuccess) {
    EVar7 = PDFWriter::WritePageAndRelease(&local_ee0,this);
    if (EVar7 != eSuccess) {
      lVar10 = 0x15;
      pcVar12 = "Failed to write page\n";
      goto LAB_00154bf4;
    }
    EVar7 = PDFWriter::EndPDF(&local_ee0);
    if (EVar7 != eSuccess) {
      lVar10 = 0x12;
      pcVar12 = "Failed to end pdf\n";
      goto LAB_00154bf4;
    }
    iVar11 = 0;
  }
  else {
    lVar10 = 0x1e;
    pcVar12 = "Failed to end content context\n";
LAB_00154bf4:
    iVar11 = 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,lVar10);
  }
  _Var13._M_p = local_1078._M_dataplus._M_p;
  if ((string *)local_1078._M_dataplus._M_p != &local_1078) {
    do {
      paVar3 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)_Var13._M_p;
      operator_delete(_Var13._M_p,0x20);
      _Var13._M_p = (pointer)paVar3;
    } while ((string *)paVar3 != &local_1078);
  }
LAB_0015474e:
  PDFWriter::~PDFWriter(&local_ee0);
  return iVar11;
}

Assistant:

int TestMeasurementsTest(int argc, char* argv[])
{
	EStatusCode status = eSuccess;
	PDFWriter pdfWriter;

	do
	{
		status = pdfWriter.StartPDF(BuildRelativeOutputPath(argv,"TextMeasurementsTest.pdf"),
                                    ePDFVersion13,
                                    LogConfiguration(true,true,
                                                     BuildRelativeOutputPath(argv,"TextMeasurementsTest.log")));
		if(status != eSuccess)
		{
			cout<<"Failed to start file\n";
			break;
		}

		PDFPage* page = new PDFPage();
		page->SetMediaBox(PDFRectangle(0,0,595,842));
		
		PageContentContext* cxt = pdfWriter.StartPageContentContext(page);
		PDFUsedFont* arialFont = pdfWriter.GetFontForFile(
                                                     BuildRelativeInputPath(
                                                                            argv,
                                                                            "fonts/arial.ttf"));
		if(!arialFont)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to create font for arial font\n";
			break;
		}

		AbstractContentContext::GraphicOptions pathStrokeOptions(AbstractContentContext::eStroke,
																AbstractContentContext::eRGB,
																AbstractContentContext::ColorValueForName("DarkMagenta"),
																4);
		AbstractContentContext::TextOptions textOptions(arialFont,
														14,
														AbstractContentContext::eGray,
														0);

		PDFUsedFont::TextMeasures textDimensions = arialFont->CalculateTextDimensions("Hello World",14);

		cxt->WriteText(10,100,"Hello World",textOptions);
		DoubleAndDoublePairList pathPoints;
		pathPoints.push_back(DoubleAndDoublePair(10+textDimensions.xMin,98+textDimensions.yMin));
		pathPoints.push_back(DoubleAndDoublePair(10+textDimensions.xMax,98+textDimensions.yMin));
		cxt->DrawPath(pathPoints,pathStrokeOptions);
		pathPoints.clear();
		pathPoints.push_back(DoubleAndDoublePair(10+textDimensions.xMin,102+textDimensions.yMax));
		pathPoints.push_back(DoubleAndDoublePair(10+textDimensions.xMax,102+textDimensions.yMax));
		cxt->DrawPath(pathPoints,pathStrokeOptions);

		status = pdfWriter.EndPageContentContext(cxt);
		if(status != eSuccess)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to end content context\n";
			break;
		}

		status = pdfWriter.WritePageAndRelease(page);
		if(status != eSuccess)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to write page\n";
			break;
		}


		status = pdfWriter.EndPDF();
		if(status != eSuccess)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to end pdf\n";
			break;
		}

	}while(false);


	return status == eSuccess ? 0:1;
}